

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

uint __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,int id,int depth,QStringList *propertyNames,
          QDBusPlatformMenu *topLevelMenu)

{
  QDBusPlatformMenu *menu;
  QLoggingCategory *pQVar1;
  QDebug *pQVar2;
  QDBusPlatformMenuItem *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  int in_stack_ffffffffffffff6c;
  QArrayDataPointer<char16_t> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_58._24_8_ = pQVar1->name;
    local_58._0_4_ = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58._20_4_ = 0;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<((QDebug *)&local_80,id);
    pQVar2 = QDebug::operator<<(pQVar2,"depth");
    pQVar2 = QDebug::operator<<(pQVar2,depth);
    local_68._0_8_ = pQVar2->stream;
    ((Stream *)local_68._0_8_)->ref = ((Stream *)local_68._0_8_)->ref + 1;
    ::operator<<((Stream *)(local_68 + 8),(QList<QString> *)local_68);
    QDebug::~QDebug((QDebug *)(local_68 + 8));
    QDebug::~QDebug((QDebug *)local_68);
    QDebug::~QDebug((QDebug *)&local_80);
  }
  this->m_id = id;
  if (id == 0) {
    latin1.m_data = "children-display";
    latin1.m_size = 0x10;
    QString::QString((QString *)&local_80,latin1);
    ::QVariant::QVariant((QVariant *)local_58,(QLatin1String *)0x7);
    QMap<QString,_QVariant>::insert(&this->m_properties,(QString *)&local_80,(QVariant *)local_58);
    ::QVariant::~QVariant((QVariant *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    uVar4 = 1;
    if (topLevelMenu != (QDBusPlatformMenu *)0x0) {
      populate(this,topLevelMenu,depth,propertyNames);
    }
  }
  else {
    pQVar3 = QDBusPlatformMenuItem::byId(in_stack_ffffffffffffff6c);
    uVar4 = 1;
    if ((pQVar3 != (QDBusPlatformMenuItem *)0x0) &&
       (menu = (QDBusPlatformMenu *)pQVar3->m_subMenu, menu != (QDBusPlatformMenu *)0x0)) {
      if (depth != 0) {
        populate(this,menu,depth,propertyNames);
      }
      uVar4 = menu->m_revision;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

uint QDBusMenuLayoutItem::populate(int id, int depth, const QStringList &propertyNames, const QDBusPlatformMenu *topLevelMenu)
{
    qCDebug(qLcMenu) << id << "depth" << depth << propertyNames;
    m_id = id;
    if (id == 0) {
        m_properties.insert("children-display"_L1, "submenu"_L1);
        if (topLevelMenu)
            populate(topLevelMenu, depth, propertyNames);
        return 1; // revision
    }

    QDBusPlatformMenuItem *item = QDBusPlatformMenuItem::byId(id);
    if (item) {
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());

        if (menu) {
            if (depth != 0)
                populate(menu, depth, propertyNames);
            return menu->revision();
        }
    }

    return 1; // revision
}